

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O0

time_point __thiscall jaegertracing::Span::startTimeSystem(Span *this)

{
  duration dVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  Span *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_20,(mutex_type *)(this + 0x148));
  dVar1.__r = *(rep *)(this + 0xe8);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return (time_point)(duration)dVar1.__r;
}

Assistant:

SystemClock::time_point startTimeSystem() const
    {
        std::lock_guard<std::mutex> lock(_mutex);
        return _startTimeSystem;
    }